

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O2

void __thiscall Assimp::ValidateDSProcess::Validate(ValidateDSProcess *this,aiAnimation *pAnimation)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  
  Validate(this,&pAnimation->mName);
  uVar1 = pAnimation->mNumChannels;
  if (uVar1 == 0) {
    if (pAnimation->mNumMorphMeshChannels == 0) {
      ReportError(this,
                  "aiAnimation::mNumChannels is 0. At least one node animation channel must be there."
                 );
    }
  }
  else if (pAnimation->mChannels == (aiNodeAnim **)0x0) {
    pcVar3 = "aiAnimation::mChannels is NULL (aiAnimation::mNumChannels is %i)";
    uVar2 = uVar1;
    goto LAB_0031e21d;
  }
  if ((pAnimation->mMorphMeshChannels != (aiMeshMorphAnim **)0x0) ||
     (uVar2 = pAnimation->mNumMorphMeshChannels, uVar2 == 0)) {
    uVar4 = 0;
    do {
      if (uVar1 <= uVar4) {
        uVar4 = 0;
        while( true ) {
          if (pAnimation->mNumMorphMeshChannels <= uVar4) {
            return;
          }
          if (pAnimation->mMorphMeshChannels[uVar4] == (aiMeshMorphAnim *)0x0) break;
          Validate(this,pAnimation,pAnimation->mMorphMeshChannels[uVar4]);
          uVar4 = uVar4 + 1;
        }
        pcVar3 = 
        "aiAnimation::mMorphMeshChannels[%i] is NULL (aiAnimation::mNumMorphMeshChannels is %i)";
LAB_0031e201:
        ReportError(this,pcVar3,uVar4 & 0xffffffff);
      }
      if (pAnimation->mChannels[uVar4] == (aiNodeAnim *)0x0) {
        pcVar3 = "aiAnimation::mChannels[%i] is NULL (aiAnimation::mNumChannels is %i)";
        goto LAB_0031e201;
      }
      Validate(this,pAnimation,pAnimation->mChannels[uVar4]);
      uVar4 = uVar4 + 1;
      uVar1 = pAnimation->mNumChannels;
    } while( true );
  }
  pcVar3 = "aiAnimation::mMorphMeshChannels is NULL (aiAnimation::mNumMorphMeshChannels is %i)";
LAB_0031e21d:
  ReportError(this,pcVar3,(ulong)uVar2);
}

Assistant:

void ValidateDSProcess::Validate( const aiAnimation* pAnimation)
{
    Validate(&pAnimation->mName);

    // validate all animations
    if (pAnimation->mNumChannels || pAnimation->mNumMorphMeshChannels)
    {
        if (!pAnimation->mChannels && pAnimation->mNumChannels) {
            ReportError("aiAnimation::mChannels is NULL (aiAnimation::mNumChannels is %i)",
                pAnimation->mNumChannels);
        }
        if (!pAnimation->mMorphMeshChannels && pAnimation->mNumMorphMeshChannels) {
            ReportError("aiAnimation::mMorphMeshChannels is NULL (aiAnimation::mNumMorphMeshChannels is %i)",
                pAnimation->mNumMorphMeshChannels);
        }
        for (unsigned int i = 0; i < pAnimation->mNumChannels;++i)
        {
            if (!pAnimation->mChannels[i])
            {
                ReportError("aiAnimation::mChannels[%i] is NULL (aiAnimation::mNumChannels is %i)",
                    i, pAnimation->mNumChannels);
            }
            Validate(pAnimation, pAnimation->mChannels[i]);
        }
        for (unsigned int i = 0; i < pAnimation->mNumMorphMeshChannels;++i)
        {
            if (!pAnimation->mMorphMeshChannels[i])
            {
                ReportError("aiAnimation::mMorphMeshChannels[%i] is NULL (aiAnimation::mNumMorphMeshChannels is %i)",
                    i, pAnimation->mNumMorphMeshChannels);
            }
            Validate(pAnimation, pAnimation->mMorphMeshChannels[i]);
        }
    }
    else {
    	ReportError("aiAnimation::mNumChannels is 0. At least one node animation channel must be there.");
    }
}